

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hh
# Opt level: O1

intb __thiscall StartInstructionValue::getValue(StartInstructionValue *this,ParserWalker *walker)

{
  ParserContext *pPVar1;
  
  pPVar1 = walker->cross_context;
  if (pPVar1 == (ParserContext *)0x0) {
    pPVar1 = walker->const_context;
  }
  return (pPVar1->addr).offset / (ulong)((pPVar1->addr).base)->wordsize;
}

Assistant:

const Address &getAddr(void) const { if (cross_context != (const ParserContext *)0) { return cross_context->getAddr(); } return const_context->getAddr(); }